

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::ResolveLanguageCompiler
          (cmGlobalGenerator *this,string *lang,cmMakefile *mf,bool optional)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string_view arg;
  undefined8 name_00;
  bool bVar1;
  ulong uVar2;
  cmake *pcVar3;
  cmState *pcVar4;
  reference value;
  string *psVar5;
  char *value_00;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  cmValue local_220;
  cmValue cvars;
  string pathString;
  string local_1e0;
  undefined1 local_1c0 [8];
  string cnameString;
  string changeVars;
  undefined1 local_168 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cnameArgVec;
  cmValue cname;
  string local_130;
  undefined1 local_110 [8];
  string path;
  string *name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  cmValue local_b0;
  cmAlphaNum local_a8;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string langComp;
  bool optional_local;
  cmMakefile *mf_local;
  string *lang_local;
  cmGlobalGenerator *this_local;
  
  langComp.field_2._M_local_buf[0xf] = optional;
  cmAlphaNum::cmAlphaNum(&local_78,"CMAKE_");
  cmAlphaNum::cmAlphaNum(&local_a8,lang);
  cmStrCat<char[10]>((string *)local_48,&local_78,&local_a8,(char (*) [10])0xd2b242);
  local_b0 = cmMakefile::GetDefinition(mf,(string *)local_48);
  bVar1 = cmValue::operator_cast_to_bool(&local_b0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    path.field_2._8_8_ = cmMakefile::GetRequiredDefinition(mf,(string *)local_48);
    std::__cxx11::string::string((string *)local_110);
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)path.field_2._8_8_);
    name_00 = path.field_2._8_8_;
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_110,(string *)path.field_2._8_8_);
    }
    else {
      cname.Value = (string *)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cname);
      cmsys::SystemTools::FindProgram
                (&local_130,(string *)name_00,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cname,false);
      std::__cxx11::string::operator=((string *)local_110,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cname);
    }
    if (((langComp.field_2._M_local_buf[0xf] & 1U) != 0) ||
       ((uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0 &&
        (bVar1 = cmsys::SystemTools::FileExists((string *)local_110), bVar1)))) {
      pcVar3 = GetCMakeInstance(this);
      pcVar4 = cmake::GetState(pcVar3);
      cnameArgVec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)cmState::GetInitializedCacheValue(pcVar4,(string *)local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_168);
      bVar1 = cmValue::operator_cast_to_bool
                        ((cmValue *)
                         &cnameArgVec.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        cmValue::operator->[abi_cxx11_
                  ((cmValue *)
                   &cnameArgVec.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          psVar5 = cmValue::operator*[abi_cxx11_
                             ((cmValue *)
                              &cnameArgVec.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          arg = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
          cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_168,false);
          value = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_168);
          cmValue::cmValue((cmValue *)((long)&changeVars.field_2 + 8),value);
          cnameArgVec.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)changeVars.field_2._8_8_;
        }
      }
      std::__cxx11::string::string((string *)(cnameString.field_2._M_local_buf + 8));
      bVar1 = cmValue::operator_cast_to_bool
                        ((cmValue *)
                         &cnameArgVec.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((bVar1) && ((langComp.field_2._M_local_buf[0xf] & 1U) == 0)) {
        std::__cxx11::string::string((string *)local_1c0);
        psVar5 = cmValue::operator*[abi_cxx11_
                           ((cmValue *)
                            &cnameArgVec.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = cmsys::SystemTools::FileIsFullPath(psVar5);
        if (bVar1) {
          psVar5 = cmValue::operator*[abi_cxx11_
                             ((cmValue *)
                              &cnameArgVec.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::operator=((string *)local_1c0,(string *)psVar5);
        }
        else {
          psVar5 = cmValue::operator*[abi_cxx11_
                             ((cmValue *)
                              &cnameArgVec.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pathString.field_2._8_8_ = 0;
          this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&pathString.field_2 + 8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(this_00);
          cmsys::SystemTools::FindProgram(&local_1e0,psVar5,this_00,false);
          std::__cxx11::string::operator=((string *)local_1c0,(string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&pathString.field_2 + 8));
        }
        std::__cxx11::string::string((string *)&cvars,(string *)local_110);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_1c0);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)&cvars);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1c0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&cvars);
        if (bVar1) {
          pcVar3 = GetCMakeInstance(this);
          pcVar4 = cmake::GetState(pcVar3);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_240,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_241);
          local_220 = cmState::GetGlobalProperty(pcVar4,&local_240);
          std::__cxx11::string::~string((string *)&local_240);
          std::allocator<char>::~allocator(&local_241);
          bVar1 = cmValue::operator_cast_to_bool(&local_220);
          if (bVar1) {
            psVar5 = cmValue::operator*[abi_cxx11_(&local_220);
            std::__cxx11::string::operator+=
                      ((string *)(cnameString.field_2._M_local_buf + 8),(string *)psVar5);
            std::__cxx11::string::operator+=((string *)(cnameString.field_2._M_local_buf + 8),";");
          }
          std::__cxx11::string::operator+=
                    ((string *)(cnameString.field_2._M_local_buf + 8),(string *)local_48);
          std::__cxx11::string::operator+=((string *)(cnameString.field_2._M_local_buf + 8),";");
          psVar5 = cmValue::operator*[abi_cxx11_
                             ((cmValue *)
                              &cnameArgVec.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::operator+=
                    ((string *)(cnameString.field_2._M_local_buf + 8),(string *)psVar5);
          pcVar3 = GetCMakeInstance(this);
          pcVar4 = cmake::GetState(pcVar3);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_268,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_269);
          value_00 = (char *)std::__cxx11::string::c_str();
          cmState::SetGlobalProperty(pcVar4,&local_268,value_00);
          std::__cxx11::string::~string((string *)&local_268);
          std::allocator<char>::~allocator(&local_269);
        }
        std::__cxx11::string::~string((string *)&cvars);
        std::__cxx11::string::~string((string *)local_1c0);
      }
      std::__cxx11::string::~string((string *)(cnameString.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_168);
    }
    std::__cxx11::string::~string((string *)local_110);
  }
  else if ((langComp.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   " not set, after EnableLanguage");
    cmSystemTools::Error(&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmGlobalGenerator::ResolveLanguageCompiler(const std::string& lang,
                                                cmMakefile* mf,
                                                bool optional) const
{
  std::string langComp = cmStrCat("CMAKE_", lang, "_COMPILER");

  if (!mf->GetDefinition(langComp)) {
    if (!optional) {
      cmSystemTools::Error(langComp + " not set, after EnableLanguage");
    }
    return;
  }
  std::string const& name = mf->GetRequiredDefinition(langComp);
  std::string path;
  if (!cmSystemTools::FileIsFullPath(name)) {
    path = cmSystemTools::FindProgram(name);
  } else {
    path = name;
  }
  if (!optional && (path.empty() || !cmSystemTools::FileExists(path))) {
    return;
  }
  cmValue cname =
    this->GetCMakeInstance()->GetState()->GetInitializedCacheValue(langComp);

  // Split compiler from arguments
  std::vector<std::string> cnameArgVec;
  if (cname && !cname->empty()) {
    cmExpandList(*cname, cnameArgVec);
    cname = cmValue(cnameArgVec.front());
  }

  std::string changeVars;
  if (cname && !optional) {
    std::string cnameString;
    if (!cmSystemTools::FileIsFullPath(*cname)) {
      cnameString = cmSystemTools::FindProgram(*cname);
    } else {
      cnameString = *cname;
    }
    std::string pathString = path;
    // get rid of potentially multiple slashes:
    cmSystemTools::ConvertToUnixSlashes(cnameString);
    cmSystemTools::ConvertToUnixSlashes(pathString);
    if (cnameString != pathString) {
      cmValue cvars = this->GetCMakeInstance()->GetState()->GetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_");
      if (cvars) {
        changeVars += *cvars;
        changeVars += ";";
      }
      changeVars += langComp;
      changeVars += ";";
      changeVars += *cname;
      this->GetCMakeInstance()->GetState()->SetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_", changeVars.c_str());
    }
  }
}